

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readpsm.c
# Opt level: O3

int it_psm_process_sample(IT_SAMPLE *sample,uchar *data,int len,int id,int version)

{
  byte bVar1;
  byte bVar2;
  int32 iVar3;
  uint uVar4;
  uint uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  void *pvVar9;
  long lVar10;
  char cVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  
  iVar12 = -1;
  if (0x5f < len) {
    bVar1 = *data;
    uVar14 = (ulong)(version != 0xe5aba);
    *(undefined2 *)(sample->name + 0x20) = *(undefined2 *)(data + uVar14 * 4 + 0x2d);
    uVar6 = *(undefined8 *)(data + uVar14 * 4 + 0xd);
    uVar7 = *(undefined8 *)(data + uVar14 * 4 + 0xd + 8);
    uVar8 = *(undefined8 *)(data + uVar14 * 4 + 0x1d + 8);
    *(undefined8 *)(sample->name + 0x10) = *(undefined8 *)(data + uVar14 * 4 + 0x1d);
    *(undefined8 *)(sample->name + 0x18) = uVar8;
    *(undefined8 *)sample->name = uVar6;
    *(undefined8 *)(sample->name + 8) = uVar7;
    sample->name[0x22] = '\0';
    if ((uint)*(ushort *)(data + uVar14 * 4 + 0x34) == id) {
      uVar13 = *(uint *)(data + uVar14 * 4 + 0x36);
      if (uVar13 == 0) {
        sample->flags = sample->flags & 0xfe;
      }
      else {
        if ((bVar1 & 0x7f) != 0 || len + -0x60 < (int)uVar13) {
          return -1;
        }
        iVar3 = *(int32 *)(data + uVar14 * 5 + 0x49);
        uVar4 = *(uint *)(data + uVar14 * 4 + 0x3e);
        uVar5 = *(uint *)(data + uVar14 * 4 + 0x3a);
        bVar2 = data[uVar14 * 5 + 0x44];
        sample->flags = '\x01';
        sample->global_volume = '@';
        sample->length = uVar13;
        sample->loop_start = uVar5;
        sample->loop_end = uVar4;
        sample->C5_speed = iVar3;
        sample->default_volume = bVar2 >> 1;
        sample->default_pan = '\0';
        sample->filename[0] = '\0';
        sample->vibrato_speed = '\0';
        sample->vibrato_depth = '\0';
        sample->vibrato_rate = '\0';
        sample->vibrato_waveform = '\0';
        sample->finetune = 0;
        sample->max_resampling_quality = -1;
        if ((uVar5 < uVar4 && bVar1 != 0) && uVar4 <= uVar13) {
          sample->length = uVar4;
          sample->flags = '\x11';
          uVar13 = uVar4;
        }
        pvVar9 = malloc((long)(int)uVar13);
        sample->data = pvVar9;
        if (pvVar9 == (void *)0x0) {
          return -1;
        }
        if (0 < (int)uVar13) {
          lVar10 = 0;
          cVar11 = '\0';
          do {
            cVar11 = cVar11 + data[lVar10 + 0x60];
            *(char *)((long)sample->data + lVar10) = cVar11;
            lVar10 = lVar10 + 1;
          } while (lVar10 < sample->length);
          return 0;
        }
      }
      iVar12 = 0;
    }
  }
  return iVar12;
}

Assistant:

static int it_psm_process_sample(IT_SAMPLE * sample, const unsigned char * data, int len, int id, int version) {
	int flags;
	int insno = 0;
	int length = 0;
	int loopstart = 0;
	int loopend = 0;
	int panpos;
	int defvol = 0;
	int samplerate = 0;

	if (len < 0x60) return -1;

	flags = data[0];

	if (version == PSMV_OLD) {
		memcpy(sample->name, data + 0x0D, 34);
		sample->name[34] = 0;

		insno = data[0x34] | (data[0x35] << 8);
		length = data[0x36] | (data[0x37] << 8) | (data[0x38] << 16) | (data[0x39] << 24);
		loopstart = data[0x3A] | (data[0x3B] << 8) | (data[0x3C] << 16) | (data[0x3D] << 24);
		loopend = data[0x3E] | (data[0x3F] << 8) | (data[0x40] << 16) | (data[0x41] << 24);
		panpos = data[0x43];
		defvol = data[0x44];
		samplerate = data[0x49] | (data[0x4A] << 8) | (data[0x4B] << 16) | (data[0x4C] << 24);
	} else /*if (version == PSMV_NEW)*/ {
		memcpy(sample->name, data + 0x11, 34);
		sample->name[34] = 0;

		insno = data[0x38] | (data[0x39] << 8);
		length = data[0x3A] | (data[0x3B] << 8) | (data[0x3C] << 16) | (data[0x3D] << 24);
		loopstart = data[0x3E] | (data[0x3F] << 8) | (data[0x40] << 16) | (data[0x41] << 24);
		loopend = data[0x42] | (data[0x43] << 8) | (data[0x44] << 16) | (data[0x45] << 24);
		panpos = data[0x48];
		defvol = data[0x49];
		samplerate = data[0x4E] | (data[0x4F] << 8) | (data[0x50] << 16) | (data[0x51] << 24);
	}

	if (insno != id) return -1;

	if (!length) {
		sample->flags &= ~IT_SAMPLE_EXISTS;
		return 0;
	}
	
	if ((length > len - 0x60) || ((flags & 0x7F) != 0)) return -1;

	sample->flags = IT_SAMPLE_EXISTS;
	sample->length = length;
	sample->loop_start = loopstart;
	sample->loop_end = loopend;
	sample->C5_speed = samplerate;
	sample->default_volume = defvol >> 1;
	sample->default_pan = 0;
	sample->filename[0] = 0;
	sample->global_volume = 64;
	sample->vibrato_speed = 0;
	sample->vibrato_depth = 0;
	sample->vibrato_rate = 0;
	sample->vibrato_waveform = IT_VIBRATO_SINE;
	sample->finetune = 0;
	sample->max_resampling_quality = -1;

	if (flags & 0x80) {
		if (((unsigned int)sample->loop_end <= (unsigned int)sample->length) &&
			((unsigned int)sample->loop_start < (unsigned int)sample->loop_end)) {
			sample->length = sample->loop_end;
			sample->flags |= IT_SAMPLE_LOOP;
		}
	}

	sample->data = malloc(sample->length);
	if (!sample->data)
		return -1;

	flags = 0;
	data += 0x60;

	for (insno = 0; insno < sample->length; insno++) {
		flags += (signed char)(*data++);
		((signed char *)sample->data)[insno] = flags;
	}

	return 0;
}